

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall
SuiteMessageTests::TestallocationInstructionParseGetString::~TestallocationInstructionParseGetString
          (TestallocationInstructionParseGetString *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(allocationInstructionParseGetString)
{
  AllocationInstruction object;

  object.getHeader().setField(SenderCompID("SENDER"));
  object.getHeader().setField(TargetCompID("TARGET"));
  object.getHeader().setField(MsgSeqNum(1));
  FIX44::Header::NoHops hops;
  hops.setField(HopCompID("HOP1"));
  hops.setField(HopRefID(1));
  object.getHeader().addGroup(hops);
  hops.setField(HopCompID("HOP2"));
  hops.setField(HopRefID(2));
  object.getHeader().addGroup(hops);
  object.setField(AllocID("Alloc001"));
  object.setField(AllocTransType(AllocTransType_NEW));
  object.setField(AllocType(AllocType_CALCULATED));
  object.setField(AllocNoOrdersType(AllocNoOrdersType_NOT_SPECIFIED));
  object.setField(Quantity(100));
  object.setField(AvgPx(23.1));
  object.setField(TradeDate("20170317"));

  CHECK_EQUAL(
          "8=FIX.4.4\0019=121\00135=J\00134=1\00149=SENDER\00156=TARGET\001627=2\001"
          "628=HOP1\001630=1\001628=HOP2\001630=2\0016=23.1\00153=100\00170=Alloc001\001"
          "71=0\00175=20170317\001626=1\001857=0\00110=159\001", object.toString());
}